

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

bool starts_with_quadratic(string_view buf_1,string_view buf_2)

{
  int iVar1;
  size_t __n;
  size_type __rlen_2;
  char *__s1;
  size_type __rlen;
  
  __s1 = buf_1._M_str;
  __n = buf_2._M_len;
  if (buf_1._M_len == 1) {
    iVar1 = bcmp(__s1,"[",1);
    if (iVar1 == 0) {
      return true;
    }
    iVar1 = bcmp(__s1,"+",1);
    if ((__n == 1 && iVar1 == 0) && (iVar1 = bcmp(buf_2._M_str,"[",__n), iVar1 == 0)) {
      return true;
    }
    iVar1 = bcmp(__s1,"-",1);
    if (__n == 1 && iVar1 == 0) {
      iVar1 = bcmp(buf_2._M_str,"[",__n);
      return iVar1 == 0;
    }
  }
  return false;
}

Assistant:

[[nodiscard]] bool set_bound_variable(bound_token bound)
    {
        auto id = get_variable(bound.name);
        if (id < 0)
            return false;

        // We only use a binary/integer solver.
        // m_problem.vars.values[id].min = bound.min;
        // m_problem.vars.values[id].max = bound.max;

        m_problem.vars.values[id].min =
          (bound.min == -std::numeric_limits<double>::infinity()
             ? std::numeric_limits<int>::min()
             : static_cast<int>(bound.min));

        m_problem.vars.values[id].max =
          (bound.max == std::numeric_limits<double>::infinity()
             ? std::numeric_limits<int>::max()
             : static_cast<int>(bound.max));

        return true;
    }